

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushFocusScope(ImGuiID id)

{
  ImGuiID in_EDI;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindow *v;
  
  v = GImGui->CurrentWindow;
  ImVector<unsigned_int>::push_back((ImVector<unsigned_int> *)GImGui,(uint *)v);
  (v->DC).NavFocusScopeIdCurrent = in_EDI;
  return;
}

Assistant:

void ImGui::PushFocusScope(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->IDStack.push_back(window->DC.NavFocusScopeIdCurrent);
    window->DC.NavFocusScopeIdCurrent = id;
}